

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_rotate_by_euler_angles_EXP(quaternion *self,double ax,double ay,double az)

{
  undefined1 local_48 [8];
  quaternion qT;
  double az_local;
  double ay_local;
  double ax_local;
  quaternion *self_local;
  
  qT.field_0.q[3] = az;
  quaternion_set_from_euler_anglesf3((quaternion *)local_48,ax,ay,az);
  quaternion_rotate_by_quaternion_EXP(self,(quaternion *)local_48);
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_rotate_by_euler_angles_EXP(struct quaternion *self, HYP_FLOAT ax, HYP_FLOAT ay, HYP_FLOAT az)
{
	struct quaternion qT;

	/* make a quaternion from the eulers */
	quaternion_set_from_euler_anglesf3(&qT, ax, ay, az);

	/* rotate the quaternion by it */
	quaternion_rotate_by_quaternion_EXP(self, &qT);

	return self;
}